

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  TokenType TVar1;
  string_view message;
  string local_a0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_STRING) {
    text->_M_string_length = 0;
    *(text->_M_dataplus)._M_p = '\0';
    while ((this->tokenizer_).current_.type == TYPE_STRING) {
      io::Tokenizer::ParseStringAppend(&(this->tokenizer_).current_.text,text);
      io::Tokenizer::Next(&this->tokenizer_);
    }
  }
  else {
    local_50[0] = absl::lts_20250127::NullSafeStringView("Expected string, got: ");
    local_80.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_80.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)local_50,&local_80,(AlphaNum *)local_80.piece_._M_len);
    message._M_str = local_a0._M_dataplus._M_p;
    message._M_len = local_a0._M_string_length;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError(
          absl::StrCat("Expected string, got: ", tokenizer_.current().text));
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }